

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx2::LineSegmentsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  float fVar2;
  BBox1f BVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  bool bVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  size_t *psVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  size_t sVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  float fVar22;
  float fVar26;
  float fVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar28;
  undefined1 extraout_var [56];
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar57;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  float fVar66;
  size_t local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar65._0_8_ = Geometry::getTimeRange((Geometry *)this);
  auVar65._8_56_ = extraout_var;
  auVar31._8_8_ = 0;
  auVar31._0_4_ = time_range->lower;
  auVar31._4_4_ = time_range->upper;
  auVar23 = auVar65._0_16_;
  auVar24 = vcmpps_avx(auVar23,auVar31,1);
  auVar25 = vblendps_avx(auVar31,auVar23,2);
  auVar23 = vinsertps_avx(auVar23,auVar31,0x50);
  auVar25 = vblendvps_avx(auVar23,auVar25,auVar24);
  auVar24 = vmovshdup_avx(auVar25);
  fVar22 = auVar25._0_4_;
  fVar29 = auVar24._0_4_;
  if (fVar22 <= fVar29) {
    uVar11 = r->_begin;
    local_78 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                lower.field_0.m128;
    local_88 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                upper.field_0.m128;
    local_98 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                lower.field_0.m128;
    local_a8 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                upper.field_0.m128;
    local_b0 = __return_storage_ptr__->end;
    if (uVar11 < r->_end) {
      auVar65 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      do {
        auVar51._8_4_ = 0x5dccb9a2;
        auVar51._0_8_ = 0x5dccb9a25dccb9a2;
        auVar23._8_4_ = 0xddccb9a2;
        auVar23._0_8_ = 0xddccb9a2ddccb9a2;
        auVar51._12_4_ = 0x5dccb9a2;
        auVar23._12_4_ = 0xddccb9a2;
        BVar3 = (this->super_LineSegments).super_Geometry.time_range;
        auVar24._8_8_ = 0;
        auVar24._0_4_ = BVar3.lower;
        auVar24._4_4_ = BVar3.upper;
        fVar1 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
        auVar25 = vmovshdup_avx(auVar24);
        auVar25 = vsubps_avx(auVar25,auVar24);
        lVar19 = *(long *)&(this->super_LineSegments).super_Geometry.field_0x58;
        uVar4 = *(uint *)(lVar19 + *(long *)&(this->super_LineSegments).field_0x68 * uVar11);
        pBVar5 = (this->super_LineSegments).vertices.items;
        if ((ulong)(uVar4 + 1) < (pBVar5->super_RawBufferView).num) {
          auVar24 = ZEXT416((uint)(fVar1 * ((fVar29 - BVar3.lower) / auVar25._0_4_) * 0.99999976));
          auVar24 = vroundss_avx(auVar24,auVar24,10);
          auVar24 = vminss_avx(auVar24,ZEXT416((uint)fVar1));
          uVar17 = (uint)auVar24._0_4_;
          auVar25 = ZEXT416((uint)(fVar1 * ((fVar22 - BVar3.lower) / auVar25._0_4_) * 1.0000002));
          auVar25 = vroundss_avx(auVar25,auVar25,9);
          auVar25 = vmaxss_avx(ZEXT816(0) << 0x40,auVar25);
          uVar9 = (uint)auVar25._0_4_;
          bVar6 = uVar17 < uVar9;
          if (uVar9 <= uVar17) {
            uVar15 = (ulong)(int)uVar9;
            pcVar12 = pBVar5[uVar15].super_RawBufferView.ptr_ofs;
            sVar18 = pBVar5[uVar15].super_RawBufferView.stride;
            auVar25 = *(undefined1 (*) [16])(pcVar12 + sVar18 * uVar4);
            auVar24 = vcmpps_avx(auVar25,auVar23,2);
            auVar31 = vcmpps_avx(auVar25,auVar51,5);
            auVar24 = vorps_avx(auVar24,auVar31);
            if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar24 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar24 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar24[0xf]) {
              psVar13 = &pBVar5[uVar15 + 1].super_RawBufferView.stride;
              do {
                auVar24 = *(undefined1 (*) [16])(pcVar12 + sVar18 * (uVar4 + 1));
                auVar31 = vcmpps_avx(auVar24,auVar23,2);
                auVar52 = vcmpps_avx(auVar24,auVar51,5);
                auVar31 = vorps_avx(auVar31,auVar52);
                if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar31[0xf] < '\0') break;
                auVar25 = vshufps_avx(auVar25,auVar25,0xff);
                auVar24 = vshufps_avx(auVar24,auVar24,0xff);
                auVar25 = vminss_avx(auVar25,auVar24);
                if (auVar25._0_4_ < 0.0) break;
                uVar15 = uVar15 + 1;
                bVar6 = (ulong)(long)(int)uVar17 < uVar15;
                if ((ulong)(long)(int)uVar17 < uVar15) break;
                pcVar12 = ((RawBufferView *)(psVar13 + -2))->ptr_ofs;
                sVar18 = *psVar13;
                psVar13 = psVar13 + 7;
                auVar25 = *(undefined1 (*) [16])(pcVar12 + sVar18 * uVar4);
                auVar24 = vcmpps_avx(auVar25,auVar23,2);
                auVar31 = vcmpps_avx(auVar25,auVar51,5);
                auVar24 = vorps_avx(auVar24,auVar31);
              } while ((((auVar24 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                        (auVar24 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar24 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       -1 < auVar24[0xf]);
            }
          }
        }
        else {
          bVar6 = false;
        }
        auVar52._8_4_ = -INFINITY;
        auVar52._0_8_ = 0xff800000ff800000;
        auVar52._12_4_ = -INFINITY;
        auVar59 = auVar65._0_16_;
        auVar54 = auVar52;
        auVar25 = auVar59;
        if (bVar6) {
          fVar30 = (this->super_LineSegments).super_Geometry.time_range.lower;
          fVar39 = (this->super_LineSegments).super_Geometry.time_range.upper - fVar30;
          fVar66 = (fVar22 - fVar30) / fVar39;
          fVar39 = (fVar29 - fVar30) / fVar39;
          fVar30 = fVar1 * fVar66;
          fVar26 = fVar1 * fVar39;
          auVar23 = vroundss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30),9);
          auVar31 = vroundss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26),10);
          auVar51 = ZEXT816(0) << 0x40;
          auVar25 = vmaxss_avx(auVar23,auVar51);
          auVar24 = vminss_avx(auVar31,ZEXT416((uint)fVar1));
          fVar27 = auVar24._0_4_;
          iVar14 = (int)auVar23._0_4_;
          if (iVar14 < 0) {
            iVar14 = -1;
          }
          uVar4 = (int)fVar1 + 1U;
          if ((int)auVar31._0_4_ < (int)((int)fVar1 + 1U)) {
            uVar4 = (int)auVar31._0_4_;
          }
          lVar10 = (long)(int)auVar25._0_4_;
          uVar9 = *(uint *)(lVar19 + *(long *)&(this->super_LineSegments).field_0x68 * uVar11);
          uVar15 = (ulong)uVar9;
          pBVar5 = (this->super_LineSegments).vertices.items;
          pcVar12 = pBVar5[lVar10].super_RawBufferView.ptr_ofs;
          sVar18 = pBVar5[lVar10].super_RawBufferView.stride;
          lVar20 = sVar18 * uVar15;
          uVar16 = (ulong)(uVar9 + 1);
          lVar19 = sVar18 * uVar16;
          auVar31 = vminps_avx(*(undefined1 (*) [16])(pcVar12 + lVar20),
                               *(undefined1 (*) [16])(pcVar12 + lVar19));
          auVar24 = vmaxps_avx(*(undefined1 (*) [16])(pcVar12 + lVar20),
                               *(undefined1 (*) [16])(pcVar12 + lVar19));
          fVar2 = (this->super_LineSegments).maxRadiusScale;
          auVar23 = vmaxss_avx(ZEXT416(*(uint *)(pcVar12 + lVar19 + 0xc)),
                               ZEXT416(*(uint *)(pcVar12 + lVar20 + 0xc)));
          fVar28 = fVar2 * auVar23._0_4_;
          auVar55._4_4_ = fVar28;
          auVar55._0_4_ = fVar28;
          auVar55._8_4_ = fVar28;
          auVar55._12_4_ = fVar28;
          auVar52 = vsubps_avx(auVar31,auVar55);
          auVar53._0_4_ = auVar24._0_4_ + fVar28;
          auVar53._4_4_ = auVar24._4_4_ + fVar28;
          auVar53._8_4_ = auVar24._8_4_ + fVar28;
          auVar53._12_4_ = auVar24._12_4_ + fVar28;
          lVar19 = (long)(int)fVar27;
          pcVar12 = pBVar5[lVar19].super_RawBufferView.ptr_ofs;
          sVar18 = pBVar5[lVar19].super_RawBufferView.stride;
          lVar21 = sVar18 * uVar15;
          lVar20 = sVar18 * uVar16;
          auVar31 = vminps_avx(*(undefined1 (*) [16])(pcVar12 + lVar21),
                               *(undefined1 (*) [16])(pcVar12 + lVar20));
          auVar24 = vmaxps_avx(*(undefined1 (*) [16])(pcVar12 + lVar21),
                               *(undefined1 (*) [16])(pcVar12 + lVar20));
          auVar23 = vmaxss_avx(ZEXT416(*(uint *)(pcVar12 + lVar20 + 0xc)),
                               ZEXT416(*(uint *)(pcVar12 + lVar21 + 0xc)));
          fVar28 = fVar2 * auVar23._0_4_;
          auVar33._4_4_ = fVar28;
          auVar33._0_4_ = fVar28;
          auVar33._8_4_ = fVar28;
          auVar33._12_4_ = fVar28;
          auVar23 = vsubps_avx(auVar31,auVar33);
          auVar56._0_4_ = auVar24._0_4_ + fVar28;
          auVar56._4_4_ = auVar24._4_4_ + fVar28;
          auVar56._8_4_ = auVar24._8_4_ + fVar28;
          auVar56._12_4_ = auVar24._12_4_ + fVar28;
          auVar25 = ZEXT416((uint)(fVar30 - auVar25._0_4_));
          if (uVar4 - iVar14 == 1) {
            auVar25 = vmaxss_avx(auVar25,auVar51);
            fVar30 = auVar25._0_4_;
            fVar1 = 1.0 - fVar30;
            auVar49._0_4_ = fVar30 * auVar23._0_4_;
            auVar49._4_4_ = fVar30 * auVar23._4_4_;
            auVar49._8_4_ = fVar30 * auVar23._8_4_;
            auVar49._12_4_ = fVar30 * auVar23._12_4_;
            auVar34._4_4_ = fVar1;
            auVar34._0_4_ = fVar1;
            auVar34._8_4_ = fVar1;
            auVar34._12_4_ = fVar1;
            auVar59 = vfmadd231ps_fma(auVar49,auVar34,auVar52);
            auVar32._0_4_ = fVar30 * auVar56._0_4_;
            auVar32._4_4_ = fVar30 * auVar56._4_4_;
            auVar32._8_4_ = fVar30 * auVar56._8_4_;
            auVar32._12_4_ = fVar30 * auVar56._12_4_;
            auVar54 = vfmadd231ps_fma(auVar32,auVar53,auVar34);
            auVar25 = vmaxss_avx(ZEXT416((uint)(fVar27 - fVar26)),auVar51);
            fVar30 = auVar25._0_4_;
            fVar1 = 1.0 - fVar30;
            auVar44._0_4_ = auVar52._0_4_ * fVar30;
            auVar44._4_4_ = auVar52._4_4_ * fVar30;
            auVar44._8_4_ = auVar52._8_4_ * fVar30;
            auVar44._12_4_ = auVar52._12_4_ * fVar30;
            auVar41._4_4_ = fVar1;
            auVar41._0_4_ = fVar1;
            auVar41._8_4_ = fVar1;
            auVar41._12_4_ = fVar1;
            auVar25 = vfmadd213ps_fma(auVar23,auVar41,auVar44);
            auVar35._0_4_ = fVar30 * auVar53._0_4_;
            auVar35._4_4_ = fVar30 * auVar53._4_4_;
            auVar35._8_4_ = fVar30 * auVar53._8_4_;
            auVar35._12_4_ = fVar30 * auVar53._12_4_;
            auVar52 = vfmadd213ps_fma(auVar56,auVar41,auVar35);
          }
          else {
            pcVar12 = pBVar5[lVar10 + 1].super_RawBufferView.ptr_ofs;
            sVar18 = pBVar5[lVar10 + 1].super_RawBufferView.stride;
            lVar20 = sVar18 * uVar15;
            lVar10 = sVar18 * uVar16;
            auVar51 = vminps_avx(*(undefined1 (*) [16])(pcVar12 + lVar20),
                                 *(undefined1 (*) [16])(pcVar12 + lVar10));
            auVar31 = vmaxss_avx(ZEXT416(*(uint *)(pcVar12 + lVar10 + 0xc)),
                                 ZEXT416(*(uint *)(pcVar12 + lVar20 + 0xc)));
            auVar24 = vmaxps_avx(*(undefined1 (*) [16])(pcVar12 + lVar20),
                                 *(undefined1 (*) [16])(pcVar12 + lVar10));
            fVar30 = auVar31._0_4_ * fVar2;
            auVar60._4_4_ = fVar30;
            auVar60._0_4_ = fVar30;
            auVar60._8_4_ = fVar30;
            auVar60._12_4_ = fVar30;
            auVar54 = vsubps_avx(auVar51,auVar60);
            pcVar12 = pBVar5[lVar19 + -1].super_RawBufferView.ptr_ofs;
            sVar18 = pBVar5[lVar19 + -1].super_RawBufferView.stride;
            lVar10 = sVar18 * uVar15;
            lVar19 = sVar18 * uVar16;
            auVar59 = vminps_avx(*(undefined1 (*) [16])(pcVar12 + lVar10),
                                 *(undefined1 (*) [16])(pcVar12 + lVar19));
            auVar51 = vmaxss_avx(ZEXT416(*(uint *)(pcVar12 + lVar19 + 0xc)),
                                 ZEXT416(*(uint *)(pcVar12 + lVar10 + 0xc)));
            auVar31 = vmaxps_avx(*(undefined1 (*) [16])(pcVar12 + lVar10),
                                 *(undefined1 (*) [16])(pcVar12 + lVar19));
            fVar28 = auVar51._0_4_ * fVar2;
            auVar63._4_4_ = fVar28;
            auVar63._0_4_ = fVar28;
            auVar63._8_4_ = fVar28;
            auVar63._12_4_ = fVar28;
            auVar51 = vsubps_avx(auVar59,auVar63);
            auVar25 = vmaxss_avx(auVar25,ZEXT416(0));
            fVar48 = auVar25._0_4_;
            fVar40 = 1.0 - fVar48;
            auVar62._0_4_ = auVar54._0_4_ * fVar48;
            auVar62._4_4_ = auVar54._4_4_ * fVar48;
            auVar62._8_4_ = auVar54._8_4_ * fVar48;
            auVar62._12_4_ = auVar54._12_4_ * fVar48;
            auVar64._4_4_ = fVar40;
            auVar64._0_4_ = fVar40;
            auVar64._8_4_ = fVar40;
            auVar64._12_4_ = fVar40;
            auVar59 = vfmadd213ps_fma(auVar52,auVar64,auVar62);
            auVar36._0_4_ = fVar48 * (fVar30 + auVar24._0_4_);
            auVar36._4_4_ = fVar48 * (fVar30 + auVar24._4_4_);
            auVar36._8_4_ = fVar48 * (fVar30 + auVar24._8_4_);
            auVar36._12_4_ = fVar48 * (fVar30 + auVar24._12_4_);
            auVar54 = vfmadd213ps_fma(auVar53,auVar64,auVar36);
            auVar25 = vmaxss_avx(ZEXT416((uint)(fVar27 - fVar26)),ZEXT816(0) << 0x20);
            fVar26 = auVar25._0_4_;
            fVar30 = 1.0 - fVar26;
            auVar45._0_4_ = auVar51._0_4_ * fVar26;
            auVar45._4_4_ = auVar51._4_4_ * fVar26;
            auVar45._8_4_ = auVar51._8_4_ * fVar26;
            auVar45._12_4_ = auVar51._12_4_ * fVar26;
            auVar42._4_4_ = fVar30;
            auVar42._0_4_ = fVar30;
            auVar42._8_4_ = fVar30;
            auVar42._12_4_ = fVar30;
            auVar25 = vfmadd213ps_fma(auVar23,auVar42,auVar45);
            auVar37._0_4_ = (auVar31._0_4_ + fVar28) * fVar26;
            auVar37._4_4_ = (auVar31._4_4_ + fVar28) * fVar26;
            auVar37._8_4_ = (auVar31._8_4_ + fVar28) * fVar26;
            auVar37._12_4_ = (auVar31._12_4_ + fVar28) * fVar26;
            auVar52 = vfmadd213ps_fma(auVar56,auVar42,auVar37);
            uVar9 = iVar14 + 1;
            if ((int)uVar9 < (int)uVar4) {
              psVar13 = &pBVar5[uVar9].super_RawBufferView.stride;
              auVar65 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar24 = auVar59;
              auVar23 = auVar54;
              do {
                fVar40 = ((float)(int)uVar9 / fVar1 - fVar66) / (fVar39 - fVar66);
                fVar30 = 1.0 - fVar40;
                auVar50._0_4_ = auVar25._0_4_ * fVar40;
                fVar26 = auVar25._4_4_;
                auVar50._4_4_ = fVar26 * fVar40;
                fVar27 = auVar25._8_4_;
                auVar50._8_4_ = fVar27 * fVar40;
                fVar28 = auVar25._12_4_;
                auVar50._12_4_ = fVar28 * fVar40;
                auVar46._4_4_ = fVar30;
                auVar46._0_4_ = fVar30;
                auVar46._8_4_ = fVar30;
                auVar46._12_4_ = fVar30;
                auVar54 = vfmadd231ps_fma(auVar50,auVar46,auVar24);
                auVar43._0_4_ = auVar52._0_4_ * fVar40;
                fVar48 = auVar52._4_4_;
                auVar43._4_4_ = fVar48 * fVar40;
                fVar57 = auVar52._8_4_;
                auVar43._8_4_ = fVar57 * fVar40;
                fVar58 = auVar52._12_4_;
                auVar43._12_4_ = fVar58 * fVar40;
                auVar33 = vfmadd231ps_fma(auVar43,auVar23,auVar46);
                pcVar12 = ((RawBufferView *)(psVar13 + -2))->ptr_ofs;
                lVar10 = *psVar13 * uVar15;
                lVar19 = *psVar13 * uVar16;
                auVar59 = vminps_avx(*(undefined1 (*) [16])(pcVar12 + lVar10),
                                     *(undefined1 (*) [16])(pcVar12 + lVar19));
                auVar51 = vmaxss_avx(ZEXT416(*(uint *)(pcVar12 + lVar19 + 0xc)),
                                     ZEXT416(*(uint *)(pcVar12 + lVar10 + 0xc)));
                auVar31 = vmaxps_avx(*(undefined1 (*) [16])(pcVar12 + lVar10),
                                     *(undefined1 (*) [16])(pcVar12 + lVar19));
                fVar30 = auVar51._0_4_ * fVar2;
                auVar61._4_4_ = fVar30;
                auVar61._0_4_ = fVar30;
                auVar61._8_4_ = fVar30;
                auVar61._12_4_ = fVar30;
                auVar51 = vsubps_avx(auVar59,auVar61);
                auVar51 = vsubps_avx(auVar51,auVar54);
                auVar47._0_4_ = fVar30 + auVar31._0_4_;
                auVar47._4_4_ = fVar30 + auVar31._4_4_;
                auVar47._8_4_ = fVar30 + auVar31._8_4_;
                auVar47._12_4_ = fVar30 + auVar31._12_4_;
                auVar31 = vsubps_avx(auVar47,auVar33);
                auVar51 = vminps_avx(auVar51,ZEXT416(0) << 0x20);
                auVar31 = vmaxps_avx(auVar31,ZEXT416(0) << 0x20);
                auVar59._0_4_ = auVar24._0_4_ + auVar51._0_4_;
                auVar59._4_4_ = auVar24._4_4_ + auVar51._4_4_;
                auVar59._8_4_ = auVar24._8_4_ + auVar51._8_4_;
                auVar59._12_4_ = auVar24._12_4_ + auVar51._12_4_;
                auVar25._0_4_ = auVar25._0_4_ + auVar51._0_4_;
                auVar25._4_4_ = fVar26 + auVar51._4_4_;
                auVar25._8_4_ = fVar27 + auVar51._8_4_;
                auVar25._12_4_ = fVar28 + auVar51._12_4_;
                auVar54._0_4_ = auVar23._0_4_ + auVar31._0_4_;
                auVar54._4_4_ = auVar23._4_4_ + auVar31._4_4_;
                auVar54._8_4_ = auVar23._8_4_ + auVar31._8_4_;
                auVar54._12_4_ = auVar23._12_4_ + auVar31._12_4_;
                auVar52._0_4_ = auVar52._0_4_ + auVar31._0_4_;
                auVar52._4_4_ = fVar48 + auVar31._4_4_;
                auVar52._8_4_ = fVar57 + auVar31._8_4_;
                auVar52._12_4_ = fVar58 + auVar31._12_4_;
                uVar9 = uVar9 + 1;
                psVar13 = psVar13 + 7;
                auVar24 = auVar59;
                auVar23 = auVar54;
              } while (uVar4 != uVar9);
            }
            else {
              auVar65 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
          }
        }
        sVar18 = k;
        if (bVar6) {
          auVar25 = vminps_avx(auVar59,auVar25);
          aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar25,ZEXT416(geomID),0x30);
          auVar25 = vmaxps_avx(auVar54,auVar52);
          aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar25,ZEXT416((uint)uVar11),0x30);
          local_78 = vminps_avx(local_78,(undefined1  [16])aVar7);
          local_88 = vmaxps_avx(local_88,(undefined1  [16])aVar8);
          auVar38._0_4_ = aVar7.x + aVar8.x;
          auVar38._4_4_ = aVar7.y + aVar8.y;
          auVar38._8_4_ = aVar7.z + aVar8.z;
          auVar38._12_4_ = aVar7.field_3.w + aVar8.field_3.w;
          local_98 = vminps_avx(local_98,auVar38);
          local_a8 = vmaxps_avx(local_a8,auVar38);
          local_b0 = local_b0 + 1;
          sVar18 = k + 1;
          prims[k].lower.field_0.field_1 = aVar7;
          prims[k].upper.field_0.field_1 = aVar8;
        }
        uVar11 = uVar11 + 1;
        k = sVar18;
      } while (uVar11 < r->_end);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_78._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_78._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_88._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_88._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_98._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_98._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_a8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_a8._8_8_;
    __return_storage_ptr__->end = local_b0;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }